

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::createImagesIter(CopyImageTest *this)

{
  State *pSVar1;
  Functions *pFVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 formatB;
  undefined4 extraout_var;
  ObjectWrapper *pOVar5;
  ObjectTraits *pOVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_368;
  MessageBuilder local_1e8;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_68;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *dstImageLevels;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *srcImageLevels;
  ObjectWrapper *dstImage;
  ObjectWrapper *srcImage;
  State *local_38;
  Random *rng;
  Functions *pFStack_28;
  deUint32 moreRestrictiveFormat;
  Functions *gl;
  RenderContext *renderContext;
  TestLog *log;
  CopyImageTest *this_local;
  
  log = (TestLog *)this;
  renderContext =
       (RenderContext *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  gl = (Functions *)gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (**(_func_int **)((long)gl->activeShaderProgram + 0x18))();
  pFStack_28 = (Functions *)CONCAT44(extraout_var,iVar3);
  dVar4 = ImageInfo::getFormat(&this->m_srcImageInfo);
  formatB = ImageInfo::getFormat(&this->m_dstImageInfo);
  rng._4_4_ = getMoreRestrictiveFormat(dVar4,formatB);
  local_38 = this->m_state;
  pOVar5 = (ObjectWrapper *)operator_new(0x18);
  pFVar2 = pFStack_28;
  pOVar6 = getObjectTraits(&this->m_srcImageInfo);
  glu::ObjectWrapper::ObjectWrapper(pOVar5,pFVar2,pOVar6);
  this->m_state->srcImage = pOVar5;
  pOVar5 = (ObjectWrapper *)operator_new(0x18);
  pFVar2 = pFStack_28;
  pOVar6 = getObjectTraits(&this->m_dstImageInfo);
  glu::ObjectWrapper::ObjectWrapper(pOVar5,pFVar2,pOVar6);
  this->m_state->dstImage = pOVar5;
  dstImage = this->m_state->srcImage;
  srcImageLevels =
       (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        *)this->m_state->dstImage;
  dstImageLevels = &this->m_state->srcImageLevels;
  local_68 = &this->m_state->dstImageLevels;
  tcu::TestLog::operator<<
            (&local_1e8,(TestLog *)renderContext,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [23])"Creating source image.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  pFVar2 = pFStack_28;
  pSVar1 = local_38;
  dVar4 = glu::ObjectWrapper::operator*(dstImage);
  genImage(pFVar2,&pSVar1->rng,dVar4,dstImageLevels,&this->m_srcImageInfo,rng._4_4_);
  tcu::TestLog::operator<<
            (&local_368,(TestLog *)renderContext,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_368,(char (*) [28])"Creating destination image.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_368);
  pFVar2 = pFStack_28;
  pSVar1 = local_38;
  dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)srcImageLevels);
  genImage(pFVar2,&pSVar1->rng,dVar4,local_68,&this->m_dstImageInfo,rng._4_4_);
  return;
}

Assistant:

void CopyImageTest::createImagesIter (void)
{
	TestLog&				log						= m_testCtx.getLog();
	glu::RenderContext&		renderContext			= m_context.getRenderContext();
	const glw::Functions&	gl						= renderContext.getFunctions();
	const deUint32			moreRestrictiveFormat	= getMoreRestrictiveFormat(m_srcImageInfo.getFormat(), m_dstImageInfo.getFormat());
	de::Random&				rng						= m_state->rng;

	DE_ASSERT(!m_state->srcImage);
	DE_ASSERT(!m_state->dstImage);

	m_state->srcImage = new glu::ObjectWrapper(gl, getObjectTraits(m_srcImageInfo));
	m_state->dstImage = new glu::ObjectWrapper(gl, getObjectTraits(m_dstImageInfo));

	{
		glu::ObjectWrapper&				srcImage				= *m_state->srcImage;
		glu::ObjectWrapper&				dstImage				= *m_state->dstImage;

		vector<ArrayBuffer<deUint8> >&	srcImageLevels			= m_state->srcImageLevels;
		vector<ArrayBuffer<deUint8> >&	dstImageLevels			= m_state->dstImageLevels;

		log << TestLog::Message << "Creating source image." << TestLog::EndMessage;
		genImage(gl, rng, *srcImage, srcImageLevels, m_srcImageInfo, moreRestrictiveFormat);

		log << TestLog::Message << "Creating destination image." << TestLog::EndMessage;
		genImage(gl, rng, *dstImage, dstImageLevels, m_dstImageInfo, moreRestrictiveFormat);
	}
}